

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O2

int run_test_poll_duplex(void)

{
  test_mode = 0;
  start_poll_test();
  return 0;
}

Assistant:

TEST_IMPL(poll_duplex) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  test_mode = DUPLEX;
  start_poll_test();
  return 0;
}